

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QMimeTypeXMLData>::emplace<QMimeTypeXMLData_const&>
          (QHash<QString,_QMimeTypeXMLData> *this,QString *key,QMimeTypeXMLData *args)

{
  long lVar1;
  QMimeTypeXMLData *in_RDI;
  long in_FS_OFFSET;
  piter pVar2;
  QString copy;
  QString *in_stack_ffffffffffffff68;
  QString *in_stack_ffffffffffffff70;
  QString *in_stack_ffffffffffffffc8;
  QHash<QString,_QMimeTypeXMLData> *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pVar2 = (piter)emplace<QMimeTypeXMLData_const&>
                           (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_RDI);
  QString::~QString((QString *)0x908ea5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }